

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_frame_reference_mode(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_S32 RVar1;
  RK_U8 local_30 [8];
  RK_U32 value;
  RK_S32 err;
  AV1RawFrameHeader *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  if ((current->frame_type == '\x02') || (current->frame_type == '\0')) {
    current->reference_select = '\0';
  }
  else {
    _value = current;
    current_local = (AV1RawFrameHeader *)gb;
    gb_local = &ctx->gb;
    RVar1 = mpp_av1_read_unsigned(gb,1,"reference_select",(RK_U32 *)local_30,0,1);
    if (RVar1 < 0) {
      return RVar1;
    }
    _value->reference_select = local_30[0];
  }
  return 0;
}

Assistant:

static RK_S32 mpp_av1_frame_reference_mode(AV1Context *ctx, BitReadCtx_t *gb,
                                           AV1RawFrameHeader *current)
{
    RK_S32 err;
    (void)ctx;
    if (current->frame_type == AV1_FRAME_INTRA_ONLY ||
        current->frame_type == AV1_FRAME_KEY)
        infer(reference_select, 0);
    else
        flag(reference_select);

    return 0;
}